

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t validation_layer::zeInit(ze_init_flags_t flags)

{
  Logger *this;
  code *pcVar1;
  undefined8 *puVar2;
  long *plVar3;
  long lVar4;
  ze_result_t result;
  ze_result_t zVar5;
  size_t i;
  long lVar6;
  long lVar7;
  size_t i_1;
  allocator local_51;
  string local_50;
  
  lVar4 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string((string *)&local_50,"zeInit(flags)",&local_51);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar1 = *(code **)(lVar4 + 0x90);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar7 = *(long *)(lVar4 + 0xd38) - *(long *)(lVar4 + 0xd30) >> 3;
    lVar6 = 0;
    do {
      if (lVar7 == lVar6) {
        zVar5 = (*pcVar1)(flags);
        lVar6 = 0;
        goto LAB_00147a76;
      }
      puVar2 = (undefined8 *)**(undefined8 **)(*(long *)(lVar4 + 0xd30) + lVar6 * 8);
      result = (**(code **)*puVar2)(puVar2,flags);
      lVar6 = lVar6 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_00147a9d;
  while( true ) {
    plVar3 = (long *)**(undefined8 **)(*(long *)(lVar4 + 0xd30) + lVar6 * 8);
    result = (**(code **)(*plVar3 + 8))(plVar3,flags,zVar5);
    lVar6 = lVar6 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_00147a76:
    result = zVar5;
    if (lVar7 == lVar6) break;
  }
LAB_00147a9d:
  logAndPropagateResult("zeInit",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeInit(
        ze_init_flags_t flags                           ///< [in] initialization flags.
                                                        ///< must be 0 (default) or a combination of ::ze_init_flag_t.
        )
    {
        context.logger->log_trace("zeInit(flags)");

        auto pfnInit = context.zeDdiTable.Global.pfnInit;

        if( nullptr == pfnInit )
            return logAndPropagateResult("zeInit", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeInitPrologue( flags );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeInit", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeInitPrologue( flags );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeInit", result);
        }

        auto driver_result = pfnInit( flags );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeInitEpilogue( flags ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeInit", result);
        }

        return logAndPropagateResult("zeInit", driver_result);
    }